

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall QGraphicsItem::grabMouse(QGraphicsItem *this)

{
  QGraphicsItemPrivate *pQVar1;
  QGraphicsScene *pQVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  char local_28 [24];
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d;
  pQVar2 = pQVar1->scene;
  if (pQVar2 == (QGraphicsScene *)0x0) {
    pcVar3 = "QGraphicsItem::grabMouse: cannot grab mouse without scene";
  }
  else {
    if ((pQVar1->field_0x160 & 0x20) != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        QGraphicsScenePrivate::grabMouse(*(QGraphicsScenePrivate **)&pQVar2->field_0x8,this,false);
        return;
      }
      goto LAB_00575a99;
    }
    pcVar3 = "QGraphicsItem::grabMouse: cannot grab mouse while invisible";
  }
  local_10 = "default";
  local_28[0x14] = '\0';
  local_28[0x15] = '\0';
  local_28[0x16] = '\0';
  local_28[0x17] = '\0';
  local_28[0xc] = '\0';
  local_28[0xd] = '\0';
  local_28[0xe] = '\0';
  local_28[0xf] = '\0';
  local_28[0x10] = '\0';
  local_28[0x11] = '\0';
  local_28[0x12] = '\0';
  local_28[0x13] = '\0';
  local_28[4] = '\0';
  local_28[5] = '\0';
  local_28[6] = '\0';
  local_28[7] = '\0';
  local_28[8] = '\0';
  local_28[9] = '\0';
  local_28[10] = '\0';
  local_28[0xb] = '\0';
  local_28[0] = '\x02';
  local_28[1] = '\0';
  local_28[2] = '\0';
  local_28[3] = '\0';
  QMessageLogger::warning(local_28,pcVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_00575a99:
  __stack_chk_fail();
}

Assistant:

void QGraphicsItem::grabMouse()
{
    if (!d_ptr->scene) {
        qWarning("QGraphicsItem::grabMouse: cannot grab mouse without scene");
        return;
    }
    if (!d_ptr->visible) {
        qWarning("QGraphicsItem::grabMouse: cannot grab mouse while invisible");
        return;
    }
    d_ptr->scene->d_func()->grabMouse(this);
}